

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

scalar __thiscall
absl::make_unique<s2builderutil::S2PolylineLayer,S2Polyline*&>(absl *this,S2Polyline **args)

{
  S2Polyline *polyline;
  S2PolylineLayer *this_00;
  Options local_20;
  S2Polyline **local_18;
  S2Polyline **args_local;
  
  local_18 = args;
  args_local = (S2Polyline **)this;
  this_00 = (S2PolylineLayer *)operator_new(0x28);
  polyline = *local_18;
  s2builderutil::S2PolylineLayer::Options::Options(&local_20);
  s2builderutil::S2PolylineLayer::S2PolylineLayer(this_00,polyline,&local_20);
  std::
  unique_ptr<s2builderutil::S2PolylineLayer,std::default_delete<s2builderutil::S2PolylineLayer>>::
  unique_ptr<std::default_delete<s2builderutil::S2PolylineLayer>,void>
            ((unique_ptr<s2builderutil::S2PolylineLayer,std::default_delete<s2builderutil::S2PolylineLayer>>
              *)this,this_00);
  return (__uniq_ptr_data<s2builderutil::S2PolylineLayer,_std::default_delete<s2builderutil::S2PolylineLayer>,_true,_true>
          )(__uniq_ptr_data<s2builderutil::S2PolylineLayer,_std::default_delete<s2builderutil::S2PolylineLayer>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}